

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

QString * __thiscall
QDirPrivate::resolveAbsoluteEntry(QString *__return_storage_ptr__,QDirPrivate *this)

{
  FileCache *this_00;
  QFileSystemEntry *this_01;
  __pointer_type copy;
  QAbstractFileEngine *pQVar1;
  qint16 qVar2;
  Data *pDVar3;
  qsizetype qVar4;
  Data *data;
  char16_t *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 *puVar8;
  QFileSystemEntry *this_02;
  long in_FS_OFFSET;
  bool bVar9;
  QFileSystemEntry absoluteFileSystemEntry;
  QString local_a8;
  QString local_88;
  undefined1 local_68 [52];
  qint16 qStack_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->fileCache;
  if ((this->fileCache).mutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar9 = (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar9) {
      (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar9) goto LAB_0022b0ff;
  }
  else {
LAB_0022b0ff:
    QBasicMutex::lockInternal((QBasicMutex *)this_00);
  }
  this_01 = &(this->fileCache).absoluteDirEntry;
  bVar9 = QFileSystemEntry::isEmpty(this_01);
  this_02 = this_01;
  if (bVar9) {
    this_02 = &this->dirEntry;
    bVar9 = QFileSystemEntry::isEmpty(this_02);
    if (!bVar9) {
      local_88.d.d = (Data *)0x0;
      local_88.d.ptr = (char16_t *)0x0;
      local_88.d.size = 0;
      pQVar1 = (this->fileEngine)._M_t.
               super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
               ._M_t.
               super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
               .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
      if (pQVar1 == (QAbstractFileEngine *)0x0) {
        bVar9 = QFileSystemEntry::isRelative(this_02);
        if ((bVar9) || (bVar9 = QFileSystemEntry::isClean(this_02), !bVar9)) {
          QFileSystemEngine::absoluteName((QFileSystemEntry *)local_68,this_02);
          QFileSystemEntry::filePath(&local_a8,(QFileSystemEntry *)local_68);
          pcVar5 = local_88.d.ptr;
          data = local_88.d.d;
          qVar4 = local_a8.d.size;
          pDVar3 = local_a8.d.d;
          local_a8.d.d = local_88.d.d;
          local_88.d.d = pDVar3;
          local_88.d.ptr = local_a8.d.ptr;
          local_a8.d.ptr = pcVar5;
          local_a8.d.size = local_88.d.size;
          local_88.d.size = qVar4;
          if (&data->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&data->super_QArrayData,2,0x10);
            }
          }
          if ((QArrayData *)local_68._24_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_68._24_8_,1,0x10);
            }
          }
          goto LAB_0022b2ad;
        }
        QString::operator=(&this_01->m_filePath,&this_02->m_filePath);
        QByteArray::operator=
                  (&(this->fileCache).absoluteDirEntry.m_nativeFilePath,
                   &(this->dirEntry).m_nativeFilePath);
        qVar2 = (this->dirEntry).m_firstDotInFileName;
        (this->fileCache).absoluteDirEntry.m_lastSeparator = (this->dirEntry).m_lastSeparator;
        (this->fileCache).absoluteDirEntry.m_firstDotInFileName = qVar2;
        (this->fileCache).absoluteDirEntry.m_lastDotInFileName =
             (this->dirEntry).m_lastDotInFileName;
        QFileSystemEntry::filePath(__return_storage_ptr__,this_02);
      }
      else {
        (*pQVar1->_vptr_QAbstractFileEngine[0x19])(local_68,pQVar1,3);
        uVar7 = local_68._16_8_;
        uVar6 = local_68._0_8_;
        pcVar5 = local_88.d.ptr;
        local_68._0_8_ = local_88.d.d;
        local_88.d.d = (Data *)uVar6;
        local_88.d.ptr = (char16_t *)local_68._8_8_;
        local_68._8_8_ = pcVar5;
        local_68._16_8_ = local_88.d.size;
        local_88.d.size = uVar7;
LAB_0022b2ad:
        if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
          }
        }
        stack0xffffffffffffffc8 = &DAT_aaaaaaaaaaaaaaaa;
        local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QDir::cleanPath(&local_a8,&local_88);
        QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_68,&local_a8);
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
          }
        }
        QString::operator=(&this_01->m_filePath,(QString *)local_68);
        QByteArray::operator=
                  (&(this->fileCache).absoluteDirEntry.m_nativeFilePath,
                   (QByteArray *)(local_68 + 0x18));
        puVar8 = stack0xffffffffffffffc8;
        (this->fileCache).absoluteDirEntry.m_lastSeparator = local_68._48_2_;
        (this->fileCache).absoluteDirEntry.m_firstDotInFileName = local_68._50_2_;
        qStack_34 = SUB82(puVar8,4);
        (this->fileCache).absoluteDirEntry.m_lastDotInFileName = qStack_34;
        unique0x10000a95 = puVar8;
        QFileSystemEntry::filePath(__return_storage_ptr__,(QFileSystemEntry *)local_68);
        if ((QArrayData *)local_68._24_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_68._24_8_,1,0x10);
          }
        }
        if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
          }
        }
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_0022b138;
    }
  }
  QFileSystemEntry::filePath(__return_storage_ptr__,this_02);
LAB_0022b138:
  LOCK();
  copy = (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

inline QString QDirPrivate::resolveAbsoluteEntry() const
{
    QMutexLocker locker(&fileCache.mutex);
    if (!fileCache.absoluteDirEntry.isEmpty())
        return fileCache.absoluteDirEntry.filePath();

    if (dirEntry.isEmpty())
        return dirEntry.filePath();

    QString absoluteName;
    if (!fileEngine) {
        if (!dirEntry.isRelative() && dirEntry.isClean()) {
            fileCache.absoluteDirEntry = dirEntry;
            return dirEntry.filePath();
        }

        absoluteName = QFileSystemEngine::absoluteName(dirEntry).filePath();
    } else {
        absoluteName = fileEngine->fileName(QAbstractFileEngine::AbsoluteName);
    }
    auto absoluteFileSystemEntry =
            QFileSystemEntry(QDir::cleanPath(absoluteName), QFileSystemEntry::FromInternalPath());
    fileCache.absoluteDirEntry = absoluteFileSystemEntry;
    return absoluteFileSystemEntry.filePath();
}